

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O2

int AF_DThinkerIterator_Create
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  DThinkerIterator *this;
  int iVar1;
  char *pcVar2;
  PClass *cls;
  
  if (numparam < 1) {
    param = defaultparam->Array;
    if ((param->field_0).field_3.Type != '\x03') {
LAB_0039ae72:
      pcVar2 = 
      "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
      ;
LAB_0039ae79:
      __assert_fail(pcVar2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                    ,0x2d1,
                    "int AF_DThinkerIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    cls = (PClass *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag != 1) {
      if (cls != (PClass *)0x0) goto LAB_0039ae72;
      cls = (PClass *)0x0;
    }
  }
  else {
    if (((param->field_0).field_3.Type != '\x03') ||
       (cls = (PClass *)(param->field_0).field_1.a,
       cls != (PClass *)0x0 && (param->field_0).field_1.atag != 1)) {
      pcVar2 = 
      "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
      ;
      goto LAB_0039ae79;
    }
    if (numparam != 1) {
      if (param[1].field_0.field_3.Type == '\0') goto LAB_0039ae05;
      pcVar2 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_0039ae98;
    }
    param = defaultparam->Array;
  }
  if (param[1].field_0.field_3.Type == '\0') {
LAB_0039ae05:
    iVar1 = param[1].field_0.i;
    this = (DThinkerIterator *)DObject::operator_new(0x40);
    DThinkerIterator::DThinkerIterator(this,cls,iVar1);
    if (numret < 1) {
      iVar1 = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                      ,0x2d3,
                      "int AF_DThinkerIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar1 = 1;
      VMReturn::SetPointer(ret,this,1);
    }
    return iVar1;
  }
  pcVar2 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0039ae98:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                ,0x2d2,
                "int AF_DThinkerIterator_Create(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DThinkerIterator, Create)
{
	PARAM_PROLOGUE;
	PARAM_CLASS_DEF(type, DThinker);
	PARAM_INT_DEF(statnum);
	ACTION_RETURN_OBJECT(new DThinkerIterator(type, statnum));
}